

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O3

void dlep_router_interface_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  
  paVar3 = dlep_if_get_tree(false);
  plVar4 = (paVar3->list_head).next;
  plVar5 = plVar4->next;
  plVar1 = plVar4->prev;
  paVar3 = dlep_if_get_tree(false);
  if (plVar1 != (paVar3->list_head).prev) {
    do {
      dlep_router_remove_interface((dlep_router_if *)(plVar4 + -0xb5));
      plVar1 = plVar5->next;
      plVar2 = plVar5->prev;
      paVar3 = dlep_if_get_tree(false);
      plVar4 = plVar5;
      plVar5 = plVar1;
    } while (plVar2 != (paVar3->list_head).prev);
  }
  oonf_class_remove(&_router_if_class);
  dlep_base_ip_cleanup();
  dlep_router_session_cleanup();
  dlep_extension_cleanup();
  oonf_layer2_origin_remove(&_l2_origin);
  oonf_timer_remove(&_connect_to_watchdog_class);
  return;
}

Assistant:

void
dlep_router_interface_cleanup(void) {
  struct dlep_router_if *interf, *it;

  avl_for_each_element_safe(dlep_if_get_tree(false), interf, interf._node, it) {
    dlep_router_remove_interface(interf);
  }

  oonf_class_remove(&_router_if_class);

  dlep_base_ip_cleanup();
  dlep_router_session_cleanup();
  dlep_extension_cleanup();
  oonf_layer2_origin_remove(&_l2_origin);
  oonf_timer_remove(&_connect_to_watchdog_class);
}